

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmfwpicture.c
# Opt level: O0

MMFWPictureEntry * MMFWPictureEntry_New(MMFW *mmfw,int i)

{
  uint uVar1;
  void *pvVar2;
  uint local_3c;
  void *pvStack_38;
  int i_1;
  uint8_t *datap;
  uint32_t length;
  uint32_t offset;
  MMFWPictureEntry *picture;
  int i_local;
  MMFW *mmfw_local;
  
  mmfw_local = (MMFW *)malloc(0x10);
  if (mmfw_local == (MMFW *)0x0) {
    mmfw_local = (MMFW *)0x0;
  }
  else {
    uVar1 = mmfw->offsets[i];
    *(uint32_t *)&mmfw_local->fp = mmfw->offsets[i + 1] - uVar1;
    pvVar2 = malloc((ulong)*(uint *)&mmfw_local->fp);
    *(void **)&mmfw_local->kind = pvVar2;
    fseek((FILE *)mmfw->fp,(ulong)uVar1,0);
    pvStack_38 = *(void **)&mmfw_local->kind;
    for (local_3c = 0; local_3c < *(uint *)&mmfw_local->fp; local_3c = local_3c + 1) {
      fread(pvStack_38,1,1,(FILE *)mmfw->fp);
      pvStack_38 = (void *)((long)pvStack_38 + 1);
    }
  }
  return (MMFWPictureEntry *)mmfw_local;
}

Assistant:

MMFWPictureEntry *
MMFWPictureEntry_New(MMFW *mmfw, int i)
{
	MMFWPictureEntry *picture = malloc(sizeof(MMFWPictureEntry));

	if (!picture) {
		return NULL;
	}

	uint32_t offset = mmfw->offsets[i];
	uint32_t length = mmfw->offsets[i+1] - offset;

	picture->length = length;
	picture->data = malloc(picture->length);

	fseek(mmfw->fp, (long) offset, SEEK_SET);

	/* XXX one byte at a time :\ */
	uint8_t *datap = picture->data;
	for (int i = 0; i < picture->length; i++) {
		fread(datap, 1, 1, mmfw->fp);
		datap++;
	}

	return picture;
}